

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleDeception.cpp
# Opt level: O3

void __thiscall DIS::AngleDeception::unmarshal(AngleDeception *this,DataStream *dataStream)

{
  DataStream::operator>>(dataStream,&this->_recordType);
  DataStream::operator>>(dataStream,&this->_recordLength);
  DataStream::operator>>(dataStream,&this->_padding);
  DataStream::operator>>(dataStream,&this->_emitterNumber);
  DataStream::operator>>(dataStream,&this->_beamNumber);
  DataStream::operator>>(dataStream,&this->_stateIndicator);
  DataStream::operator>>(dataStream,&this->_padding2);
  DataStream::operator>>(dataStream,&this->_azimuthOffset);
  DataStream::operator>>(dataStream,&this->_azimuthWidth);
  DataStream::operator>>(dataStream,&this->_azimuthPullRate);
  DataStream::operator>>(dataStream,&this->_azimuthPullAcceleration);
  DataStream::operator>>(dataStream,&this->_elevationOffset);
  DataStream::operator>>(dataStream,&this->_elevationWidth);
  DataStream::operator>>(dataStream,&this->_elevationPullRate);
  DataStream::operator>>(dataStream,&this->_elevationPullAcceleration);
  DataStream::operator>>(dataStream,&this->_padding3);
  return;
}

Assistant:

void AngleDeception::unmarshal(DataStream& dataStream)
{
    dataStream >> _recordType;
    dataStream >> _recordLength;
    dataStream >> _padding;
    dataStream >> _emitterNumber;
    dataStream >> _beamNumber;
    dataStream >> _stateIndicator;
    dataStream >> _padding2;
    dataStream >> _azimuthOffset;
    dataStream >> _azimuthWidth;
    dataStream >> _azimuthPullRate;
    dataStream >> _azimuthPullAcceleration;
    dataStream >> _elevationOffset;
    dataStream >> _elevationWidth;
    dataStream >> _elevationPullRate;
    dataStream >> _elevationPullAcceleration;
    dataStream >> _padding3;
}